

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O1

UChar * u_strFromUTF8WithSub_63
                  (UChar *dest,int32_t destCapacity,int32_t *pDestLength,char *src,int32_t srcLength
                  ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  bool bVar1;
  UChar *pUVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int32_t local_5c;
  int32_t local_58;
  int local_54;
  UChar *local_50;
  UChar *local_48;
  int32_t local_3c;
  int32_t *local_38;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UChar *)0x0;
  }
  if ((((destCapacity < 0) || (srcLength < -1)) || (src == (char *)0x0 && srcLength != 0)) ||
     ((0x10ffff < subchar || 0 < destCapacity && dest == (UChar *)0x0) ||
      (subchar & 0xfffff800U) == 0xd800)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UChar *)0x0;
  }
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = 0;
  }
  local_50 = dest + (uint)destCapacity;
  local_48 = dest;
  local_3c = destCapacity;
  local_38 = pDestLength;
  if (srcLength < 0) {
    local_58 = 0;
    bVar6 = *src;
    local_54 = 0;
    iVar11 = 0;
    if (destCapacity != 0 && bVar6 != 0) {
      lVar10 = 0;
      local_54 = 0;
      pcVar8 = src;
      do {
        iVar3 = (int)lVar10;
        lVar10 = (long)iVar3 + 1;
        local_58 = (int32_t)lVar10;
        if ((char)bVar6 < '\0') {
          uVar4 = (uint)bVar6;
          if ((((bVar6 & 0xf0) == 0xe0) &&
              (((byte)" 000000000000\x1000"[uVar4 & 0xf] >> ((byte)src[lVar10] >> 5) & 1) != 0)) &&
             ((byte)((byte)pcVar8[2] ^ 0x80) < 0x40)) {
            *dest = ((byte)src[lVar10] & 0x3f) << 6 | (ushort)bVar6 << 0xc | (byte)pcVar8[2] ^ 0x80;
            local_58 = iVar3 + 3;
LAB_00307b1f:
            dest = dest + 1;
LAB_00307b86:
            iVar3 = 0;
          }
          else {
            if (((byte)(bVar6 + 0x3e) < 0x1e) && ((byte)((byte)src[lVar10] ^ 0x80) < 0x40)) {
              *dest = (ushort)((uVar4 & 0x1f) << 6) | (byte)src[lVar10] ^ 0x80;
              local_58 = iVar3 + 2;
              goto LAB_00307b1f;
            }
            uVar4 = utf8_nextCharSafeBody_63((uint8_t *)src,&local_58,-1,uVar4,-1);
            if ((-1 < (int)uVar4) || (local_54 = local_54 + 1, uVar4 = subchar, -1 < subchar)) {
              if (uVar4 < 0x10000) {
                *dest = (UChar)uVar4;
                dest = dest + 1;
              }
              else {
                *dest = (short)(uVar4 >> 10) + L'ퟀ';
                if (local_50 <= dest + 1) {
                  iVar11 = iVar11 + 1;
                  iVar3 = 2;
                  dest = dest + 1;
                  goto LAB_00307b88;
                }
                dest[1] = (UChar)uVar4 & 0x3ffU | 0xdc00;
                dest = dest + 2;
              }
              goto LAB_00307b86;
            }
            *pErrorCode = U_INVALID_CHAR_FOUND;
            iVar3 = 1;
          }
LAB_00307b88:
          if (iVar3 != 0) {
            if (iVar3 != 2) goto LAB_00307dcc;
            break;
          }
        }
        else {
          *dest = (ushort)bVar6;
          dest = dest + 1;
        }
        lVar10 = (long)local_58;
        bVar6 = src[lVar10];
        if ((bVar6 == 0) || (pcVar8 = src + lVar10, local_50 <= dest)) break;
      } while( true );
    }
    lVar10 = (long)local_58;
    bVar6 = src[lVar10];
    if (bVar6 != 0) {
      do {
        lVar9 = (long)local_58 + 1;
        if ((char)bVar6 < '\0') {
          if ((((bVar6 & 0xf0) == 0xe0) &&
              (((byte)" 000000000000\x1000"[bVar6 & 0xf] >> ((byte)src[lVar9] >> 5) & 1) != 0)) &&
             (src[lVar10 + 2] < -0x40)) {
            local_58 = local_58 + 3;
LAB_00307d66:
            iVar11 = iVar11 + 1;
LAB_00307d9f:
            bVar1 = true;
          }
          else {
            if (((byte)(bVar6 + 0x3e) < 0x1e) && (src[lVar9] < -0x40)) {
              local_58 = local_58 + 2;
              goto LAB_00307d66;
            }
            local_58 = (int)lVar9;
            uVar4 = utf8_nextCharSafeBody_63((uint8_t *)src,&local_58,-1,(uint)bVar6,-1);
            if ((-1 < (int)uVar4) || (local_54 = local_54 + 1, uVar4 = subchar, -1 < subchar)) {
              iVar11 = (iVar11 - (uint)(uVar4 < 0x10000)) + 2;
              goto LAB_00307d9f;
            }
            *pErrorCode = U_INVALID_CHAR_FOUND;
            bVar1 = false;
          }
          if (!bVar1) goto LAB_00307e1a;
        }
        else {
          iVar11 = iVar11 + 1;
          local_58 = (int)lVar9;
        }
        lVar10 = (long)local_58;
        bVar6 = src[lVar10];
      } while (bVar6 != 0);
    }
  }
  else {
    local_5c = 0;
    local_54 = 0;
    do {
      uVar5 = (ulong)((long)local_50 - (long)dest) >> 1;
      uVar4 = (srcLength - local_5c) / 3;
      uVar7 = (ulong)uVar4;
      if ((int)uVar5 <= (int)uVar4) {
        uVar7 = uVar5 & 0xffffffff;
      }
      iVar3 = 6;
      if (2 < (int)uVar7) {
        do {
          iVar11 = (int)uVar7;
          lVar9 = (long)local_5c;
          lVar10 = lVar9 + 1;
          iVar3 = (int)lVar10;
          bVar6 = src[lVar9];
          if ((char)bVar6 < '\0') {
            if (((((bVar6 & 0xf0) == 0xe0) && ((int)(lVar9 + 2) < srcLength)) &&
                (((byte)" 000000000000\x1000"[bVar6 & 0xf] >> ((byte)src[lVar10] >> 5) & 1) != 0))
               && ((byte)((byte)src[lVar9 + 2] ^ 0x80) < 0x40)) {
              *dest = ((byte)src[lVar10] & 0x3f) << 6 | (ushort)bVar6 << 0xc |
                      (byte)src[lVar9 + 2] ^ 0x80;
              local_5c = local_5c + 3;
LAB_003077e1:
              dest = dest + 1;
LAB_0030784d:
              iVar3 = 0;
            }
            else {
              if (((0xe1 < (byte)(bVar6 + 0x20)) && (iVar3 != srcLength)) &&
                 ((byte)((byte)src[lVar10] ^ 0x80) < 0x40)) {
                *dest = (ushort)((bVar6 & 0x1f) << 6) | (byte)src[lVar10] ^ 0x80;
                local_5c = local_5c + 2;
                goto LAB_003077e1;
              }
              if (((subchar < 0x10000) && (bVar6 < 0xf0)) || (iVar11 = iVar11 + -1, iVar11 != 0)) {
                local_5c = iVar3;
                uVar4 = utf8_nextCharSafeBody_63((uint8_t *)src,&local_5c,srcLength,(uint)bVar6,-1);
                if (((int)uVar4 < 0) && (local_54 = local_54 + 1, uVar4 = subchar, subchar < 0)) {
                  *pErrorCode = U_INVALID_CHAR_FOUND;
                  iVar3 = 1;
                  goto LAB_0030784f;
                }
                if (uVar4 < 0x10000) {
                  *dest = (UChar)uVar4;
                  dest = dest + 1;
                }
                else {
                  *dest = (short)(uVar4 >> 10) + L'ퟀ';
                  dest[1] = (UChar)uVar4 & 0x3ffU | 0xdc00;
                  dest = dest + 2;
                }
                goto LAB_0030784d;
              }
              iVar3 = 8;
              iVar11 = 0;
            }
LAB_0030784f:
            if (iVar3 != 0) {
              if (iVar3 != 8) goto LAB_00307889;
              break;
            }
          }
          else {
            *dest = (short)(char)bVar6;
            dest = dest + 1;
            local_5c = iVar3;
          }
          uVar7 = (ulong)(iVar11 - 1);
        } while (1 < iVar11);
        iVar3 = 0;
      }
LAB_00307889:
    } while (iVar3 == 0);
    if (iVar3 != 6) {
      iVar11 = 0;
      goto LAB_00307dcc;
    }
    if ((local_5c < srcLength) && (dest < local_50)) {
      iVar11 = 0;
      do {
        lVar9 = (long)local_5c;
        lVar10 = lVar9 + 1;
        iVar3 = (int)lVar10;
        bVar6 = src[lVar9];
        if ((char)bVar6 < '\0') {
          if (((((bVar6 & 0xf0) == 0xe0) && ((int)(lVar9 + 2) < srcLength)) &&
              (((byte)" 000000000000\x1000"[bVar6 & 0xf] >> ((byte)src[lVar10] >> 5) & 1) != 0)) &&
             ((byte)((byte)src[lVar9 + 2] ^ 0x80) < 0x40)) {
            *dest = ((byte)src[lVar10] & 0x3f) << 6 | (ushort)bVar6 << 0xc |
                    (byte)src[lVar9 + 2] ^ 0x80;
            local_5c = local_5c + 3;
LAB_00307982:
            dest = dest + 1;
LAB_003079e7:
            iVar3 = 0;
          }
          else {
            if (((0xe1 < (byte)(bVar6 + 0x20)) && (iVar3 != srcLength)) &&
               ((byte)((byte)src[lVar10] ^ 0x80) < 0x40)) {
              *dest = (ushort)((bVar6 & 0x1f) << 6) | (byte)src[lVar10] ^ 0x80;
              local_5c = local_5c + 2;
              goto LAB_00307982;
            }
            local_5c = iVar3;
            uVar4 = utf8_nextCharSafeBody_63((uint8_t *)src,&local_5c,srcLength,(uint)bVar6,-1);
            if ((-1 < (int)uVar4) || (local_54 = local_54 + 1, uVar4 = subchar, -1 < subchar)) {
              if (uVar4 < 0x10000) {
                *dest = (UChar)uVar4;
                dest = dest + 1;
              }
              else {
                *dest = (short)(uVar4 >> 10) + L'ퟀ';
                if (local_50 <= dest + 1) {
                  iVar11 = iVar11 + 1;
                  iVar3 = 0xb;
                  dest = dest + 1;
                  goto LAB_003079e9;
                }
                dest[1] = (UChar)uVar4 & 0x3ffU | 0xdc00;
                dest = dest + 2;
              }
              goto LAB_003079e7;
            }
            *pErrorCode = U_INVALID_CHAR_FOUND;
            iVar3 = 1;
          }
LAB_003079e9:
          if (iVar3 != 0) {
            if (iVar3 != 0xb) goto LAB_00307dcc;
            goto LAB_00307be2;
          }
        }
        else {
          *dest = (short)(char)bVar6;
          dest = dest + 1;
          local_5c = iVar3;
        }
        if ((srcLength <= local_5c) || (local_50 <= dest)) goto LAB_00307be2;
      } while( true );
    }
    iVar11 = 0;
LAB_00307be2:
    if (local_5c < srcLength) {
      do {
        lVar9 = (long)local_5c;
        lVar10 = lVar9 + 1;
        iVar3 = (int)lVar10;
        bVar6 = src[lVar9];
        if ((char)bVar6 < '\0') {
          if (((((bVar6 & 0xf0) == 0xe0) && ((int)(lVar9 + 2) < srcLength)) &&
              (((byte)" 000000000000\x1000"[bVar6 & 0xf] >> ((byte)src[lVar10] >> 5) & 1) != 0)) &&
             (src[lVar9 + 2] < -0x40)) {
            local_5c = local_5c + 3;
LAB_00307c73:
            iVar11 = iVar11 + 1;
LAB_00307caa:
            bVar1 = true;
          }
          else {
            if (((0xe1 < (byte)(bVar6 + 0x20)) && (iVar3 != srcLength)) && (src[lVar10] < -0x40)) {
              local_5c = local_5c + 2;
              goto LAB_00307c73;
            }
            local_5c = iVar3;
            uVar4 = utf8_nextCharSafeBody_63((uint8_t *)src,&local_5c,srcLength,(uint)bVar6,-1);
            if ((-1 < (int)uVar4) || (local_54 = local_54 + 1, uVar4 = subchar, -1 < subchar)) {
              iVar11 = (iVar11 - (uint)(uVar4 < 0x10000)) + 2;
              goto LAB_00307caa;
            }
            *pErrorCode = U_INVALID_CHAR_FOUND;
            bVar1 = false;
          }
          if (!bVar1) goto LAB_00307e1a;
        }
        else {
          iVar11 = iVar11 + 1;
          local_5c = iVar3;
        }
      } while (local_5c < srcLength);
    }
  }
  iVar3 = 0;
LAB_00307dcc:
  pUVar2 = local_48;
  if (iVar3 != 0) {
    return (UChar *)0x0;
  }
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = local_54;
  }
  iVar11 = iVar11 + (int)((ulong)((long)dest - (long)local_48) >> 1);
  if (local_38 != (int32_t *)0x0) {
    *local_38 = iVar11;
  }
  u_terminateUChars_63(local_48,local_3c,iVar11,pErrorCode);
  return pUVar2;
LAB_00307e1a:
  iVar3 = 1;
  goto LAB_00307dcc;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strFromUTF8WithSub(UChar *dest,
              int32_t destCapacity,
              int32_t *pDestLength,
              const char* src,
              int32_t srcLength,
              UChar32 subchar, int32_t *pNumSubstitutions,
              UErrorCode *pErrorCode){
    /* args check */
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    UChar *pDest = dest;
    UChar *pDestLimit = dest+destCapacity;
    int32_t reqLength = 0;
    int32_t numSubstitutions=0;

    /*
     * Inline processing of UTF-8 byte sequences:
     *
     * Byte sequences for the most common characters are handled inline in
     * the conversion loops. In order to reduce the path lengths for those
     * characters, the tests are arranged in a kind of binary search.
     * ASCII (<=0x7f) is checked first, followed by the dividing point
     * between 2- and 3-byte sequences (0xe0).
     * The 3-byte branch is tested first to speed up CJK text.
     * The compiler should combine the subtractions for the two tests for 0xe0.
     * Each branch then tests for the other end of its range.
     */

    if(srcLength < 0){
        /*
         * Transform a NUL-terminated string.
         * The code explicitly checks for NULs only in the lead byte position.
         * A NUL byte in the trail byte position fails the trail byte range check anyway.
         */
        int32_t i;
        UChar32 c;
        for(i = 0; (c = (uint8_t)src[i]) != 0 && (pDest < pDestLimit);) {
            // modified copy of U8_NEXT()
            ++i;
            if(U8_IS_SINGLE(c)) {
                *pDest++=(UChar)c;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0x1f)<<6)|__t1;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), -1, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    } else if(c<=0xFFFF) {
                        *(pDest++)=(UChar)c;
                    } else {
                        *(pDest++)=U16_LEAD(c);
                        if(pDest<pDestLimit) {
                            *(pDest++)=U16_TRAIL(c);
                        } else {
                            reqLength++;
                            break;
                        }
                    }
                }
            }
        }

        /* Pre-flight the rest of the string. */
        while((c = (uint8_t)src[i]) != 0) {
            // modified copy of U8_NEXT()
            ++i;
            if(U8_IS_SINGLE(c)) {
                ++reqLength;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    ++reqLength;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    ++reqLength;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), -1, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    }
                    reqLength += U16_LENGTH(c);
                }
            }
        }
    } else /* srcLength >= 0 */ {
        /* Faster loop without ongoing checking for srcLength and pDestLimit. */
        int32_t i = 0;
        UChar32 c;
        for(;;) {
            /*
             * Each iteration of the inner loop progresses by at most 3 UTF-8
             * bytes and one UChar, for most characters.
             * For supplementary code points (4 & 2), which are rare,
             * there is an additional adjustment.
             */
            int32_t count = (int32_t)(pDestLimit - pDest);
            int32_t count2 = (srcLength - i) / 3;
            if(count > count2) {
                count = count2; /* min(remaining dest, remaining src/3) */
            }
            if(count < 3) {
                /*
                 * Too much overhead if we get near the end of the string,
                 * continue with the next loop.
                 */
                break;
            }

            do {
                // modified copy of U8_NEXT()
                c = (uint8_t)src[i++];
                if(U8_IS_SINGLE(c)) {
                    *pDest++=(UChar)c;
                } else {
                    uint8_t __t1, __t2;
                    if( /* handle U+0800..U+FFFF inline */
                            (0xe0<=(c) && (c)<0xf0) &&
                            ((i)+1)<srcLength &&
                            U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                            (__t2=src[(i)+1]-0x80)<=0x3f) {
                        *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                        i+=2;
                    } else if( /* handle U+0080..U+07FF inline */
                            ((c)<0xe0 && (c)>=0xc2) &&
                            ((i)!=srcLength) &&
                            (__t1=src[i]-0x80)<=0x3f) {
                        *pDest++ = (((c)&0x1f)<<6)|__t1;
                        ++(i);
                    } else {
                        if(c >= 0xf0 || subchar > 0xffff) {
                            // We may read up to four bytes and write up to two UChars,
                            // which we didn't account for with computing count,
                            // so we adjust it here.
                            if(--count == 0) {
                                --i;  // back out byte c
                                break;
                            }
                        }

                        /* function call for "complicated" and error cases */
                        (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                        if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                            *pErrorCode = U_INVALID_CHAR_FOUND;
                            return NULL;
                        } else if(c<=0xFFFF) {
                            *(pDest++)=(UChar)c;
                        } else {
                            *(pDest++)=U16_LEAD(c);
                            *(pDest++)=U16_TRAIL(c);
                        }
                    }
                }
            } while(--count > 0);
        }

        while(i < srcLength && (pDest < pDestLimit)) {
            // modified copy of U8_NEXT()
            c = (uint8_t)src[i++];
            if(U8_IS_SINGLE(c)) {
                *pDest++=(UChar)c;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        ((i)+1)<srcLength &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        ((i)!=srcLength) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0x1f)<<6)|__t1;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    } else if(c<=0xFFFF) {
                        *(pDest++)=(UChar)c;
                    } else {
                        *(pDest++)=U16_LEAD(c);
                        if(pDest<pDestLimit) {
                            *(pDest++)=U16_TRAIL(c);
                        } else {
                            reqLength++;
                            break;
                        }
                    }
                }
            }
        }

        /* Pre-flight the rest of the string. */
        while(i < srcLength) {
            // modified copy of U8_NEXT()
            c = (uint8_t)src[i++];
            if(U8_IS_SINGLE(c)) {
                ++reqLength;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        ((i)+1)<srcLength &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    ++reqLength;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        ((i)!=srcLength) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    ++reqLength;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    }
                    reqLength += U16_LENGTH(c);
                }
            }
        }
    }

    reqLength+=(int32_t)(pDest - dest);

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    if(pDestLength){
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest,destCapacity,reqLength,pErrorCode);

    return dest;
}